

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O0

bool __thiscall rengine::OpenGLRenderer::render(OpenGLRenderer *this)

{
  float fVar1;
  float fVar2;
  Element *pEVar3;
  vec2 *pvVar4;
  Element *pEVar5;
  OpenGLRenderer *pOVar6;
  uint uVar7;
  uint uVar8;
  Node *pNVar9;
  Surface *this_00;
  ulong uVar10;
  Element *pEVar11;
  mat4 *__dest;
  vec4 vVar12;
  uint auStack_1d0 [4];
  undefined1 auStack_1c0 [8];
  Node *pNStack_1b8;
  uint auStack_1b0 [4];
  undefined1 auStack_1a0 [8];
  Node *pNStack_198;
  uint auStack_190 [4];
  undefined8 uStack_180;
  undefined1 auStack_178 [16];
  ostream *local_168;
  ostream *local_160;
  ostream *local_158;
  ostream *local_150;
  string *local_148;
  ostream *local_140;
  OpenGLRenderer *local_138;
  undefined1 local_130 [24];
  float afStack_118 [2];
  float local_110 [2];
  float afStack_108 [2];
  Node *local_100;
  float afStack_f8 [2];
  uint local_f0;
  mat4 local_ec;
  mat4 local_a8;
  vec2 local_64;
  uint local_5c;
  uint local_58;
  uint elementCount;
  uint vertexCount;
  vec4 c;
  string local_38 [32];
  OpenGLRenderer *local_18;
  OpenGLRenderer *this_local;
  
  uStack_180 = 0x1316ff;
  local_138 = this;
  local_18 = this;
  pNVar9 = Renderer::sceneRoot(&this->super_Renderer);
  if (pNVar9 == (Node *)0x0) {
    uStack_180 = 0x13171c;
    local_150 = std::operator<<((ostream *)&std::cerr,"W [");
    local_148 = local_38;
    uStack_180 = 0x131733;
    log_timestring_abi_cxx11_();
    uStack_180 = 0x131746;
    local_140 = std::operator<<(local_150,local_148);
    uStack_180 = 0x131762;
    local_158 = std::operator<<(local_140,"]: ");
    uStack_180 = 0x13177e;
    local_160 = std::operator<<(local_158,"virtual bool rengine::OpenGLRenderer::render()");
    uStack_180 = 0x13179a;
    local_168 = std::operator<<(local_160,": ");
    uStack_180 = 0x1317b6;
    auStack_178._8_8_ =
         std::operator<<(local_168," - no \'sceneRoot\', surely this is not what you intended?");
    uStack_180 = 0x1317d2;
    std::ostream::operator<<((void *)auStack_178._8_8_,std::endl<char,std::char_traits<char>>);
    uStack_180 = 0x1317dd;
    std::__cxx11::string::~string(local_38);
    this_local._7_1_ = false;
  }
  else {
    uStack_180 = 0x13180c;
    vVar12 = Renderer::fillColor(&local_138->super_Renderer);
    elementCount = (uint)vVar12.x;
    uVar7 = elementCount;
    vertexCount = (uint)vVar12.y;
    uVar8 = vertexCount;
    c.x = vVar12.z;
    fVar1 = c.x;
    c.y = vVar12.w;
    fVar2 = c.y;
    uStack_180 = 0x13182f;
    _elementCount = vVar12._0_8_;
    c._0_8_ = vVar12._8_8_;
    glClearColor(uVar7,uVar8,fVar1,fVar2);
    uStack_180 = 0x131839;
    glClear(0x4000);
    local_138->m_numLayeredNodes = 0;
    local_138->m_numTextureNodes = 0;
    local_138->m_numRectangleNodes = 0;
    local_138->m_numTransformNodes = 0;
    local_138->m_numTransformNodesWith3d = 0;
    local_138->m_numRenderNodes = 0;
    local_138->m_additionalQuads = 0;
    local_138->m_vertexIndex = 0;
    local_138->m_elementIndex = 0;
    uStack_180 = 0x13189f;
    pNVar9 = Renderer::sceneRoot(&local_138->super_Renderer);
    uStack_180 = 0x1318ae;
    prepass(local_138,pNVar9);
    local_58 = (local_138->m_numTextureNodes + local_138->m_numLayeredNodes +
                local_138->m_numRectangleNodes + local_138->m_additionalQuads) * 4;
    if (local_58 == 0) {
      this_local._7_1_ = true;
    }
    else {
      local_138->m_vertices = (vec2 *)(auStack_178 + (ulong)local_58 * -8);
      local_5c = local_138->m_numLayeredNodes + local_138->m_numTextureNodes +
                 local_138->m_numRectangleNodes + local_138->m_numTransformNodesWith3d +
                 local_138->m_numRenderNodes;
      pEVar11 = (Element *)((vec2 *)(auStack_178 + (ulong)local_58 * -8) + (ulong)local_5c * -4);
      local_138->m_elements = pEVar11;
      pEVar3 = local_138->m_elements;
      uVar10 = (ulong)local_5c;
      *(undefined8 *)&pEVar11[-1].field_0x18 = 0x131961;
      memset(pEVar3,0,uVar10 << 5);
      pOVar6 = local_138;
      *(undefined8 *)&pEVar11[-1].field_0x18 = 0x13196d;
      pNVar9 = Renderer::sceneRoot(&pOVar6->super_Renderer);
      pOVar6 = local_138;
      *(undefined8 *)&pEVar11[-1].field_0x18 = 0x13197c;
      build(pOVar6,pNVar9);
      pOVar6 = local_138;
      if (local_5c == 0) {
        *(undefined8 *)&pEVar11[-1].field_0x18 = 0x1319a3;
        __assert_fail("elementCount > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglrenderer.h"
                      ,0x3d4,"virtual bool rengine::OpenGLRenderer::render()");
      }
      if (local_138->m_elementIndex != local_5c) {
        *(undefined8 *)&pEVar11[-1].field_0x18 = 0x1319d6;
        __assert_fail("m_elementIndex == elementCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglrenderer.h"
                      ,0x3d5,"virtual bool rengine::OpenGLRenderer::render()");
      }
      *(undefined8 *)&pEVar11[-1].field_0x18 = 0x1319e2;
      setDefaultOpenGLState(pOVar6);
      uVar10 = (ulong)local_58;
      pvVar4 = local_138->m_vertices;
      *(undefined8 *)&pEVar11[-1].field_0x18 = 0x131a08;
      glBufferData(0x8892,uVar10 << 3,pvVar4,0x88e4);
      pOVar6 = local_138;
      *(undefined8 *)&pEVar11[-1].field_0x18 = 0x131a14;
      this_00 = Renderer::targetSurface(&pOVar6->super_Renderer);
      *(undefined8 *)&pEVar11[-1].field_0x18 = 0x131a1c;
      local_64 = Surface::size(this_00);
      local_138->m_surfaceSize = local_64;
      *(undefined8 *)&pEVar11[-1].field_0x18 = 0x131a4f;
      mat4::translate2D(&local_ec,-1.0,1.0);
      fVar1 = (local_138->m_surfaceSize).x;
      fVar2 = (local_138->m_surfaceSize).y;
      *(undefined8 *)&pEVar11[-1].field_0x18 = 0x131a82;
      mat4::scale2D((mat4 *)local_130,2.0 / fVar1,-2.0 / fVar2);
      pEVar11[-1].texture = local_f0;
      pEVar11[-1].node = local_100;
      pEVar11[-1].vboOffset = (uint)afStack_f8[0];
      pEVar11[-1].z = afStack_f8[1];
      pEVar11[-2].texture = (uint)local_110[0];
      pEVar11[-2].sourceTexture = (uint)local_110[1];
      *(float *)&pEVar11[-2].field_0x18 = afStack_108[0];
      *(float *)&pEVar11[-2].field_0x1c = afStack_108[1];
      pEVar11[-2].node = (Node *)local_130._16_8_;
      pEVar11[-2].vboOffset = (uint)afStack_118[0];
      pEVar11[-2].z = afStack_118[1];
      pEVar11[-3].texture = local_130._0_4_;
      pEVar11[-3].sourceTexture = local_130._4_4_;
      *(undefined8 *)&pEVar11[-3].field_0x18 = local_130._8_8_;
      pEVar11[-3].vboOffset = 0x131ad0;
      pEVar11[-3].z = 0.0;
      mat4::operator*(&local_a8,&local_ec,*(mat4 *)&pEVar11[-3].texture);
      __dest = &local_138->m_proj;
      *(undefined8 *)&pEVar11[-1].field_0x18 = 0x131af3;
      memcpy(__dest,&local_a8,0x44);
      pOVar6 = local_138;
      if ((((byte)local_138->field_0x1f8 >> 1 & 1 ^ 0xff) & 1) == 0) {
        *(undefined8 *)&pEVar11[-1].field_0x18 = 0x131b2d;
        __assert_fail("!m_layered",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglrenderer.h"
                      ,0x3ea,"virtual bool rengine::OpenGLRenderer::render()");
      }
      if (((local_138->field_0x1f8 & 1 ^ 0xff) & 1) == 0) {
        *(undefined8 *)&pEVar11[-1].field_0x18 = 0x131b65;
        __assert_fail("!m_render3d",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglrenderer.h"
                      ,0x3eb,"virtual bool rengine::OpenGLRenderer::render()");
      }
      pEVar3 = local_138->m_elements;
      pEVar5 = local_138->m_elements;
      uVar10 = (ulong)local_5c;
      *(undefined8 *)&pEVar11[-1].field_0x18 = 0x131b89;
      render(pOVar6,pEVar3,pEVar5 + uVar10);
      pOVar6 = local_138;
      *(undefined8 *)&pEVar11[-1].field_0x18 = 0x131b99;
      activateShader(pOVar6,(Program *)0x0);
      if (local_138->m_fbo != 0) {
        *(undefined8 *)&pEVar11[-1].field_0x18 = 0x131bca;
        __assert_fail("m_fbo == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglrenderer.h"
                      ,0x3f0,"virtual bool rengine::OpenGLRenderer::render()");
      }
      local_138->m_vertices = (vec2 *)0x0;
      local_138->m_elements = (Element *)0x0;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

inline bool OpenGLRenderer::render()
{
    if (sceneRoot() == 0) {
        logw << " - no 'sceneRoot', surely this is not what you intended?" << std::endl;
        return false;
    }

    vec4 c = fillColor();
    glClearColor(c.x, c.y, c.z, c.w);
    glClear(GL_COLOR_BUFFER_BIT);

    logd << std::endl;

    m_numLayeredNodes = 0;
    m_numTextureNodes = 0;
    m_numRectangleNodes = 0;
    m_numTransformNodes = 0;
    m_numTransformNodesWith3d = 0;
    m_numRenderNodes = 0;
    m_additionalQuads = 0;
    m_vertexIndex = 0;
    m_elementIndex = 0;
    prepass(sceneRoot());

    unsigned vertexCount = (m_numTextureNodes
                            + m_numLayeredNodes
                            + m_numRectangleNodes
                            + m_additionalQuads) * 4;
    if (vertexCount == 0)
        return true;

    m_vertices = (vec2 *) alloca(vertexCount * sizeof(vec2));
    unsigned elementCount = (m_numLayeredNodes + m_numTextureNodes + m_numRectangleNodes + m_numTransformNodesWith3d + m_numRenderNodes);
    m_elements = (Element *) alloca(elementCount * sizeof(Element));
    memset(m_elements, 0, elementCount * sizeof(Element));
    // std::cout << "render: " << m_numTextureNodes << " textures, "
    //                    << m_numRectangleNodes << " rects, "
    //                    << m_numTransformNodes << " xforms, "
    //                    << m_numTransformNodesWith3d << " xforms3D, "
    //                    << m_numLayeredNodes << " layered nodes (opacity, colorfilter, blur or shadow), "
    //                    << vertexCount * sizeof(vec2) << " bytes (" << vertexCount << " vertices), "
    //                    << elementCount * sizeof(Element) << " bytes (" << elementCount << " elements)"
    //                    << std::endl;
    build(sceneRoot());
    assert(elementCount > 0);
    assert(m_elementIndex == elementCount);
    // for (unsigned i=0; i<m_elementIndex; ++i) {
    //     const Element &e = m_elements[i];
    //     std::cout << " " << std::setw(5) << i << ": " << "element=" << &e << " node=" << e.node << " " << e.node->type() << " "
    //          << (e.projection ? "projection " : "")
    //          << "vboOffset=" << std::setw(5) << e.vboOffset << " "
    //          << "groupSize=" << std::setw(3) << e.groupSize << " "
    //          << "z=" << e.z << " " << std::endl;
    // }
    // for (unsigned i=0; i<m_vertexIndex; ++i)
    //     std::cout << "vertex[" << std::setw(5) << i << "]=" << m_vertices[i] << std::endl;

    setDefaultOpenGLState();

    // setDefaultOpenGLState will leave m_vertexBuffer bound, so we just upload into it..
    glBufferData(GL_ARRAY_BUFFER, vertexCount * sizeof(vec2), m_vertices, GL_STATIC_DRAW);

    m_surfaceSize = targetSurface()->size();
    m_proj = mat4::translate2D(-1.0, 1.0)
             * mat4::scale2D(2.0f / m_surfaceSize.x, -2.0f / m_surfaceSize.y);

    assert(!m_layered);
    assert(!m_render3d);
    render(m_elements, m_elements + elementCount);

    activateShader(0);

    assert(m_fbo == 0);
    m_vertices = 0;
    m_elements = 0;

    logd << std::endl;

    return true;
}